

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

QAccessibleInterface * __thiscall
QAccessibleMainWindow::childAt(QAccessibleMainWindow *this,int x,int y)

{
  QWidgetData *pQVar1;
  QObject *pQVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  char cVar6;
  QWidget *pQVar7;
  QPoint *__return_storage_ptr__;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  QPoint rp;
  QPoint local_60;
  QPoint local_58;
  int iStack_50;
  int iStack_4c;
  undefined1 *local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
  if ((pQVar7->data->widget_attributes & 0x8000) == 0) {
    __return_storage_ptr__ = (QPoint *)0x0;
  }
  else {
    local_58.xp.m_i = 0;
    local_58.yp.m_i = 0;
    local_58 = QWidget::mapToGlobal(pQVar7,&local_58);
    pQVar1 = pQVar7->data;
    iStack_50 = ((pQVar1->crect).x2.m_i + local_58.xp.m_i.m_i) - (pQVar1->crect).x1.m_i;
    iStack_4c = ((pQVar1->crect).y2.m_i + local_58.yp.m_i.m_i) - (pQVar1->crect).y1.m_i;
    local_40.yp.m_i = y;
    local_40.xp.m_i = x;
    __return_storage_ptr__ = (QPoint *)0x0;
    cVar6 = QRect::contains(&local_58,SUB81(&local_40,0));
    if (cVar6 != '\0') {
      __return_storage_ptr__ = &local_58;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      iStack_50 = -0x55555556;
      iStack_4c = -0x55555556;
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar7 = (QWidget *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
      _q_ac_childWidgets((QWidgetList *)__return_storage_ptr__,pQVar7);
      local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar7 = (QWidget *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
      local_60.xp.m_i = x;
      local_60.yp.m_i = y;
      local_40 = QWidget::mapFromGlobal(pQVar7,&local_60);
      if (local_48 != (undefined1 *)0x0) {
        lVar5 = CONCAT44(iStack_4c,iStack_50);
        lVar9 = (long)local_48 << 3;
        lVar8 = 0;
        do {
          pQVar2 = *(QObject **)(lVar5 + lVar8);
          lVar3 = *(long *)(pQVar2 + 0x20);
          bVar4 = true;
          if (((*(byte *)(lVar3 + 0xc) & 1) == 0) && ((*(byte *)(lVar3 + 10) & 1) == 0)) {
            cVar6 = QRect::contains((QPoint *)(lVar3 + 0x14),SUB81(&local_40,0));
            if (cVar6 != '\0') {
              __return_storage_ptr__ = (QPoint *)QAccessible::queryAccessibleInterface(pQVar2);
              bVar4 = false;
            }
          }
          if (!bVar4) goto LAB_0052a7f0;
          lVar8 = lVar8 + 8;
        } while (lVar9 != lVar8);
      }
      __return_storage_ptr__ = (QPoint *)0x0;
LAB_0052a7f0:
      if (local_58 != (QPoint)0x0) {
        LOCK();
        *(int *)local_58 = *(int *)local_58 + -1;
        UNLOCK();
        if (*(int *)local_58 == 0) {
          QArrayData::deallocate((QArrayData *)local_58,8,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QAccessibleInterface *)__return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleMainWindow::childAt(int x, int y) const
{
    QWidget *w = widget();
    if (!w->isVisible())
        return nullptr;
    QPoint gp = w->mapToGlobal(QPoint(0, 0));
    if (!QRect(gp.x(), gp.y(), w->width(), w->height()).contains(x, y))
        return nullptr;

    const QWidgetList kids = _q_ac_childWidgets(mainWindow());
    QPoint rp = mainWindow()->mapFromGlobal(QPoint(x, y));
    for (QWidget *child : kids) {
        if (!child->isWindow() && !child->isHidden() && child->geometry().contains(rp)) {
            return QAccessible::queryAccessibleInterface(child);
        }
    }
    return nullptr;
}